

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O3

void __thiscall
vkt::api::anon_unknown_0::BlittingImages::copyRegionToTextureLevel
          (BlittingImages *this,ConstPixelBufferAccess src,PixelBufferAccess dst,CopyRegion region)

{
  VkFilter VVar1;
  FilterMode filter;
  ulong uVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  PixelBufferAccess *in_RDX;
  int iVar8;
  ulong uVar9;
  FilterMode FVar10;
  ConstPixelBufferAccess *in_RSI;
  ConstPixelBufferAccess *__return_storage_ptr__;
  int iVar11;
  int iVar12;
  uint height;
  ulong uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  VkOffset3D regionOffset;
  VkOffset3D regionOffset_00;
  VkOffset3D regionExtent;
  VkOffset3D regionExtent_00;
  ConstPixelBufferAccess srcSubRegion;
  PixelBufferAccess unclampedSubRegion;
  FilterMode FVar20;
  undefined4 uStack_184;
  MirrorMode local_17c;
  ConstPixelBufferAccess local_120;
  ConstPixelBufferAccess local_f8;
  ConstPixelBufferAccess local_d0;
  PixelBufferAccess local_a8;
  ConstPixelBufferAccess local_80;
  PixelBufferAccess local_58;
  
  uVar18 = src._16_8_;
  iVar16 = src.m_pitch.m_data[0];
  iVar19 = (int)src.m_data;
  iVar17 = src.m_size.m_data[2];
  iVar8 = src.m_pitch.m_data[2];
  iVar12 = (int)dst.super_ConstPixelBufferAccess.m_data;
  iVar11 = dst.super_ConstPixelBufferAccess.m_pitch.m_data[0];
  bVar3 = 3;
  bVar5 = 3;
  if (((iVar16 < iVar19 || iVar17 < iVar8) && (bVar5 = 0, iVar19 < iVar16 || iVar8 < iVar17)) &&
     (bVar5 = 2, iVar16 < iVar19 || iVar8 < iVar17)) {
    bVar5 = (iVar17 < iVar8 || iVar19 < iVar16) * '\x03' + 1;
  }
  if (((iVar11 < iVar12 ||
        dst.super_ConstPixelBufferAccess.m_size.m_data[2] <
        dst.super_ConstPixelBufferAccess.m_pitch.m_data[2]) &&
      (bVar3 = 0,
      iVar12 < iVar11 ||
      dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] <
      dst.super_ConstPixelBufferAccess.m_size.m_data[2])) &&
     (bVar3 = 2,
     iVar11 < iVar12 ||
     dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] <
     dst.super_ConstPixelBufferAccess.m_size.m_data[2])) {
    bVar3 = (dst.super_ConstPixelBufferAccess.m_size.m_data[2] <
             dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] || iVar12 < iVar11) * '\x03' + 1;
  }
  uVar9 = src._28_8_;
  iVar15 = iVar16;
  iVar7 = dst.super_ConstPixelBufferAccess.m_size.m_data[2];
  iVar14 = iVar11;
  if (bVar5 == bVar3) {
    local_17c = MIRROR_MODE_NONE;
  }
  else {
    local_17c = MIRROR_MODE_Y;
    if ((((bVar5 != 3) || (bVar3 != 1)) &&
        (((bVar5 != 1 || (bVar3 != 3)) && ((bVar5 != 2 || (bVar3 != 0)))))) &&
       ((bVar5 != 0 || (bVar3 != 2)))) {
      local_17c = MIRROR_MODE_X;
      if ((((bVar3 != 1 || bVar5 != 0) && (bVar5 != 1 || bVar3 != 0)) &&
          (bVar3 != 2 || (bVar5 ^ 3) != 0)) && (bVar5 != 2 || (bVar3 ^ 3) != 0)) {
        local_17c = MIRROR_MODE_XY;
        if (((bVar5 ^ 3) != 0 || bVar3 != 0) && (bVar5 != 0 || (bVar3 ^ 3) != 0)) {
          local_17c = MIRROR_MODE_LAST;
          goto LAB_0044a931;
        }
      }
    }
    iVar6 = iVar17;
    if (iVar8 < iVar17) {
      iVar6 = iVar8;
    }
    if (iVar19 < iVar16) {
      iVar15 = iVar19;
    }
    if (iVar8 < iVar17) {
      uVar9 = uVar18;
    }
    uVar9 = uVar9 & 0xffffffff;
    if (iVar19 < iVar16) {
      src._28_8_ = uVar18;
    }
    iVar19 = (int)((ulong)src._28_8_ >> 0x20);
    if (dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] <
        dst.super_ConstPixelBufferAccess.m_size.m_data[2]) {
      iVar7 = dst.super_ConstPixelBufferAccess.m_pitch.m_data[2];
    }
    if (iVar12 < iVar11) {
      iVar14 = iVar12;
    }
    if (dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] <
        dst.super_ConstPixelBufferAccess.m_size.m_data[2]) {
      dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] =
           dst.super_ConstPixelBufferAccess.m_size.m_data[2];
    }
    if (iVar12 < iVar11) {
      iVar12 = iVar11;
    }
    uVar18 = CONCAT44(iVar15,iVar6);
  }
LAB_0044a931:
  iVar8 = (int)uVar9 - (int)uVar18;
  iVar19 = iVar19 - iVar15;
  iVar11 = dst.super_ConstPixelBufferAccess.m_pitch.m_data[2] - iVar7;
  height = iVar12 - iVar14;
  uVar9 = (ulong)height;
  VVar1 = (this->super_CopiesAndBlittingTestInstance).m_params.field_3.filter;
  bVar4 = tcu::isCombinedDepthStencilType((in_RSI->m_format).type);
  FVar10 = (FilterMode)(VVar1 == VK_FILTER_LINEAR);
  if (bVar4) {
    bVar4 = tcu::hasDepthComponent((in_RSI->m_format).order);
    if (bVar4) {
      tcu::getSubregion(&local_f8,in_RSI,(int)uVar18,iVar15,iVar8,iVar19);
      tcu::getEffectiveDepthStencilAccess(&local_d0,&local_f8,MODE_DEPTH);
      tcu::getSubregion((PixelBufferAccess *)&local_120,in_RDX,iVar7,iVar14,iVar11,height);
      tcu::getEffectiveDepthStencilAccess
                ((PixelBufferAccess *)&local_f8,(PixelBufferAccess *)&local_120,MODE_DEPTH);
      tcu::scale((PixelBufferAccess *)&local_f8,&local_d0,FVar10);
      if (VVar1 == VK_FILTER_LINEAR) {
        tcu::getEffectiveDepthStencilAccess(&local_120,in_RSI,MODE_DEPTH);
        tcu::TextureLevel::getAccess
                  (&local_58,
                   (this->m_unclampedExpectedTextureLevel).
                   super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
                   m_data.ptr);
        uVar13 = uVar9;
        tcu::getSubregion(&local_a8,&local_58,iVar7,iVar14,iVar11,height);
        tcu::getEffectiveDepthStencilAccess((PixelBufferAccess *)&local_80,&local_a8,MODE_DEPTH);
        uVar2 = uVar18;
        regionExtent.y = 0;
        regionExtent.x = FVar10;
        filter = FVar20;
        regionOffset.z = iVar8;
        uStack_184 = (undefined4)(uVar18 >> 0x20);
        regionOffset.x = FVar20;
        regionOffset.y = uStack_184;
        regionExtent.z = (deInt32)uVar13;
        uVar18 = uVar2;
        scaleFromWholeSrcBuffer
                  ((PixelBufferAccess *)&local_80,&local_120,regionOffset,regionExtent,filter);
      }
    }
    bVar4 = tcu::hasStencilComponent((in_RSI->m_format).order);
    if (!bVar4) {
      return;
    }
    tcu::getSubregion(&local_f8,in_RSI,(int)uVar18,iVar15,iVar8,iVar19);
    tcu::getEffectiveDepthStencilAccess(&local_d0,&local_f8,MODE_STENCIL);
    tcu::getSubregion((PixelBufferAccess *)&local_120,in_RDX,iVar7,iVar14,iVar11,height);
    tcu::getEffectiveDepthStencilAccess
              ((PixelBufferAccess *)&local_f8,(PixelBufferAccess *)&local_120,MODE_STENCIL);
    blit((PixelBufferAccess *)&local_f8,&local_d0,FVar10,local_17c);
    if (VVar1 != VK_FILTER_LINEAR) {
      return;
    }
    tcu::getEffectiveDepthStencilAccess(&local_120,in_RSI,MODE_STENCIL);
    tcu::TextureLevel::getAccess
              (&local_58,
               (this->m_unclampedExpectedTextureLevel).
               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
               ptr);
    tcu::getSubregion(&local_a8,&local_58,iVar7,iVar14,iVar11,height);
    __return_storage_ptr__ = &local_80;
    tcu::getEffectiveDepthStencilAccess
              ((PixelBufferAccess *)__return_storage_ptr__,&local_a8,MODE_STENCIL);
    in_RSI = &local_120;
  }
  else {
    tcu::getSubregion(&local_d0,in_RSI,(int)uVar18,iVar15,iVar8,iVar19);
    tcu::getSubregion((PixelBufferAccess *)&local_f8,in_RDX,iVar7,iVar14,iVar11,height);
    blit((PixelBufferAccess *)&local_f8,&local_d0,FVar10,local_17c);
    if (VVar1 != VK_FILTER_LINEAR) {
      return;
    }
    tcu::TextureLevel::getAccess
              ((PixelBufferAccess *)&local_80,
               (this->m_unclampedExpectedTextureLevel).
               super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.
               ptr);
    uVar9 = (ulong)height;
    tcu::getSubregion((PixelBufferAccess *)&local_120,(PixelBufferAccess *)&local_80,iVar7,iVar14,
                      iVar11,height);
    __return_storage_ptr__ = &local_120;
  }
  regionExtent_00.y = 0;
  regionExtent_00.x = FVar10;
  FVar10 = FVar20;
  regionOffset_00.z = iVar8;
  uStack_184 = (undefined4)(uVar18 >> 0x20);
  regionOffset_00.x = FVar20;
  regionOffset_00.y = uStack_184;
  regionExtent_00.z = (deInt32)uVar9;
  scaleFromWholeSrcBuffer
            ((PixelBufferAccess *)__return_storage_ptr__,in_RSI,regionOffset_00,regionExtent_00,
             FVar10);
  return;
}

Assistant:

void BlittingImages::copyRegionToTextureLevel (tcu::ConstPixelBufferAccess src, tcu::PixelBufferAccess dst, CopyRegion region)
{
	const MirrorMode mirrorMode = getMirrorMode(region.imageBlit.srcOffsets[0],
												region.imageBlit.srcOffsets[1],
												region.imageBlit.dstOffsets[0],
												region.imageBlit.dstOffsets[1]);

	flipCoordinates(region, mirrorMode);

	const VkOffset3D					srcOffset		= region.imageBlit.srcOffsets[0];
	const VkOffset3D					srcExtent		=
	{
		region.imageBlit.srcOffsets[1].x - srcOffset.x,
		region.imageBlit.srcOffsets[1].y - srcOffset.y,
		region.imageBlit.srcOffsets[1].z - srcOffset.z
	};
	const VkOffset3D					dstOffset		= region.imageBlit.dstOffsets[0];
	const VkOffset3D					dstExtent		=
	{
		region.imageBlit.dstOffsets[1].x - dstOffset.x,
		region.imageBlit.dstOffsets[1].y - dstOffset.y,
		region.imageBlit.dstOffsets[1].z - dstOffset.z
	};
	const tcu::Sampler::FilterMode		filter			= (m_params.filter == VK_FILTER_LINEAR) ? tcu::Sampler::LINEAR : tcu::Sampler::NEAREST;

	if (tcu::isCombinedDepthStencilType(src.getFormat().type))
	{
		DE_ASSERT(src.getFormat() == dst.getFormat());
		// Scale depth.
		if (tcu::hasDepthComponent(src.getFormat().order))
		{
			const tcu::ConstPixelBufferAccess	srcSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(src, srcOffset.x, srcOffset.y, srcExtent.x, srcExtent.y), tcu::Sampler::MODE_DEPTH);
			const tcu::PixelBufferAccess		dstSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(dst, dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y), tcu::Sampler::MODE_DEPTH);
			tcu::scale(dstSubRegion, srcSubRegion, filter);

			if (filter == tcu::Sampler::LINEAR)
			{
				const tcu::ConstPixelBufferAccess	depthSrc			= getEffectiveDepthStencilAccess(src, tcu::Sampler::MODE_DEPTH);
				const tcu::PixelBufferAccess		unclampedSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(m_unclampedExpectedTextureLevel->getAccess(), dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y), tcu::Sampler::MODE_DEPTH);
				scaleFromWholeSrcBuffer(unclampedSubRegion, depthSrc, srcOffset, srcExtent, filter);
			}
		}

		// Scale stencil.
		if (tcu::hasStencilComponent(src.getFormat().order))
		{
			const tcu::ConstPixelBufferAccess	srcSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(src, srcOffset.x, srcOffset.y, srcExtent.x, srcExtent.y), tcu::Sampler::MODE_STENCIL);
			const tcu::PixelBufferAccess		dstSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(dst, dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y), tcu::Sampler::MODE_STENCIL);
			blit(dstSubRegion, srcSubRegion, filter, mirrorMode);

			if (filter == tcu::Sampler::LINEAR)
			{
				const tcu::ConstPixelBufferAccess	stencilSrc			= getEffectiveDepthStencilAccess(src, tcu::Sampler::MODE_STENCIL);
				const tcu::PixelBufferAccess		unclampedSubRegion	= getEffectiveDepthStencilAccess(tcu::getSubregion(m_unclampedExpectedTextureLevel->getAccess(), dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y), tcu::Sampler::MODE_STENCIL);
				scaleFromWholeSrcBuffer(unclampedSubRegion, stencilSrc, srcOffset, srcExtent, filter);
			}
		}
	}
	else
	{
		const tcu::ConstPixelBufferAccess	srcSubRegion	= tcu::getSubregion(src, srcOffset.x, srcOffset.y, srcExtent.x, srcExtent.y);
		const tcu::PixelBufferAccess		dstSubRegion	= tcu::getSubregion(dst, dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y);
		blit(dstSubRegion, srcSubRegion, filter, mirrorMode);

		if (filter == tcu::Sampler::LINEAR)
		{
			const tcu::PixelBufferAccess	unclampedSubRegion	= tcu::getSubregion(m_unclampedExpectedTextureLevel->getAccess(), dstOffset.x, dstOffset.y, dstExtent.x, dstExtent.y);
			scaleFromWholeSrcBuffer(unclampedSubRegion, src, srcOffset, srcExtent, filter);
		}
	}
}